

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Record.cpp
# Opt level: O2

bool __thiscall gtar::Record::operator<(Record *this,Record *rhs)

{
  Behavior BVar1;
  Format FVar2;
  Behavior BVar3;
  Format FVar4;
  Resolution RVar5;
  Resolution RVar6;
  bool bVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)&local_70,(string *)this);
  std::__cxx11::string::string((string *)&local_90,(string *)rhs);
  std::__cxx11::string::string((string *)&local_b0,(string *)&this->m_name);
  std::__cxx11::string::string((string *)&local_50,(string *)&rhs->m_name);
  BVar1 = this->m_behavior;
  FVar2 = this->m_format;
  BVar3 = rhs->m_behavior;
  FVar4 = rhs->m_format;
  RVar5 = this->m_resolution;
  RVar6 = rhs->m_resolution;
  bVar7 = std::operator<(&this->m_index,&rhs->m_index);
  bVar7 = lthelper<std::__cxx11::string>
                    (&local_b0,&local_50,
                     (int)BVar1 < (int)BVar3 ||
                     BVar1 == BVar3 &&
                     ((int)FVar2 < (int)FVar4 ||
                     FVar2 == FVar4 && ((int)RVar5 < (int)RVar6 || RVar5 == RVar6 && bVar7)));
  bVar7 = lthelper<std::__cxx11::string>(&local_70,&local_90,bVar7);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  return bVar7;
}

Assistant:

bool Record::operator<(const Record &rhs) const
    {
        return lthelper(m_group, rhs.m_group,
               lthelper(m_name, rhs.m_name,
               lthelper(m_behavior, rhs.m_behavior,
               lthelper(m_format, rhs.m_format,
               lthelper(m_resolution, rhs.m_resolution,
                        m_index < rhs.m_index)))));
    }